

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O2

void byte_array_print(char *s)

{
  bool bVar1;
  byte bVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  
  putchar(0x5b);
  bVar1 = false;
  uVar3 = extraout_RDX;
  for (; bVar2 = *s, bVar2 != 0; s = (char *)((byte *)s + 1)) {
    if (bVar1) {
      putchar(0x2c);
      bVar2 = *s;
      uVar3 = extraout_RDX_00;
    }
    printf("0x%02X",(ulong)bVar2,uVar3,bVar2);
    bVar1 = true;
    uVar3 = extraout_RDX_01;
  }
  putchar(0x5d);
  return;
}

Assistant:

static void byte_array_print(char const* s)
{
  unsigned char const* d = reinterpret_cast<unsigned char const*>(s);
  bool started = false;
  printf("[");
  for (; *d; ++d) {
    if (started) {
      printf(",");
    }
    started = true;
    printf("0x%02X", static_cast<int>(*d));
  }
  printf("]");
}